

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

void apply_visitor_to_equipped(player *p,obj_visitor_data *visitor)

{
  _Bool _Var1;
  object *poVar2;
  object *obj;
  wchar_t i;
  obj_visitor_data *visitor_local;
  player *p_local;
  
  for (obj._4_4_ = L'\0'; obj._4_4_ < (int)(uint)(p->body).count; obj._4_4_ = obj._4_4_ + L'\x01') {
    poVar2 = slot_object(p,obj._4_4_);
    if ((poVar2 != (object *)0x0) &&
       (_Var1 = (*visitor->selfunc)(poVar2,visitor->selfunc_closure), _Var1)) {
      (*visitor->usefunc)(poVar2,visitor->usefunc_closure);
    }
  }
  return;
}

Assistant:

static void apply_visitor_to_equipped(struct player *p,
	struct obj_visitor_data *visitor)
{
	int i;

	for (i = 0; i < p->body.count; ++i) {
		const struct object *obj = slot_object(p, i);

		if (obj && (*visitor->selfunc)(obj,
			visitor->selfunc_closure)) {
			(*visitor->usefunc)(obj, visitor->usefunc_closure);
		}
	}
}